

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_butterfly_16(ogg_int32_t *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar7 = (int)*(undefined8 *)x;
  iVar9 = (int)((ulong)*(undefined8 *)x >> 0x20);
  iVar5 = (int)*(undefined8 *)(x + 8);
  iVar8 = iVar7 - iVar5;
  iVar6 = (int)((ulong)*(undefined8 *)(x + 8) >> 0x20);
  iVar10 = iVar9 - iVar6;
  *x = (uint)((ulong)((long)(iVar10 + iVar8) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[1] = (uint)((ulong)((long)(iVar10 - iVar8) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  iVar8 = x[10];
  iVar10 = x[2];
  x[10] = iVar10 + iVar8;
  iVar1 = x[0xe];
  iVar2 = x[3];
  iVar3 = x[4];
  iVar4 = x[5];
  x[2] = iVar2 - x[0xb];
  x[3] = iVar8 - iVar10;
  iVar8 = x[0xc] - iVar3;
  iVar10 = x[0xd] - iVar4;
  x[4] = (uint)((ulong)((long)(iVar8 - iVar10) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[5] = (uint)((ulong)((long)(iVar10 + iVar8) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[0xb] = iVar2 + x[0xb];
  x[0xc] = iVar3 + x[0xc];
  x[0xd] = iVar4 + x[0xd];
  x[0xe] = x[6] + iVar1;
  iVar8 = x[0xf];
  x[0xf] = x[7] + iVar8;
  x[6] = iVar1 - x[6];
  x[7] = iVar8 - x[7];
  x[8] = iVar7 + iVar5;
  x[9] = iVar9 + iVar6;
  mdct_butterfly_8(x);
  mdct_butterfly_8(x + 8);
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){

  REG_TYPE r0, r1;

	   r0 = x[ 0] - x[ 8]; x[ 8] += x[ 0];
	   r1 = x[ 1] - x[ 9]; x[ 9] += x[ 1];
	   x[ 0] = MULT31((r0 + r1) , cPI2_8);
	   x[ 1] = MULT31((r1 - r0) , cPI2_8);
	   MB();

	   r0 = x[10] - x[ 2]; x[10] += x[ 2];
	   r1 = x[ 3] - x[11]; x[11] += x[ 3];
	   x[ 2] = r1; x[ 3] = r0;
	   MB();

	   r0 = x[12] - x[ 4]; x[12] += x[ 4];
	   r1 = x[13] - x[ 5]; x[13] += x[ 5];
	   x[ 4] = MULT31((r0 - r1) , cPI2_8);
	   x[ 5] = MULT31((r0 + r1) , cPI2_8);
	   MB();

	   r0 = x[14] - x[ 6]; x[14] += x[ 6];
	   r1 = x[15] - x[ 7]; x[15] += x[ 7];
	   x[ 6] = r0; x[ 7] = r1;
	   MB();

	   mdct_butterfly_8(x);
	   mdct_butterfly_8(x+8);
}